

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool cmStringCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  string_view key;
  initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  init;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_328;
  undefined8 local_310;
  char *local_308;
  code *local_300;
  undefined8 local_2f8;
  char *local_2f0;
  code *local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  code *local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  code *local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  code *local_2a0;
  undefined8 local_298;
  char *local_290;
  code *local_288;
  undefined8 local_280;
  char *local_278;
  code *local_270;
  undefined8 local_268;
  char *local_260;
  code *local_258;
  undefined8 local_250;
  char *local_248;
  code *local_240;
  undefined8 local_238;
  char *local_230;
  code *local_228;
  undefined8 local_220;
  char *local_218;
  code *local_210;
  undefined8 local_208;
  char *local_200;
  code *local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  code *local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  code *local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  code *local_198;
  undefined8 local_190;
  char *local_188;
  code *local_180;
  undefined8 local_178;
  char *local_170;
  code *local_168;
  undefined8 local_160;
  char *local_158;
  code *local_150;
  undefined8 local_148;
  char *local_140;
  code *local_138;
  undefined8 local_130;
  char *local_128;
  code *local_120;
  undefined8 local_118;
  char *local_110;
  code *local_108;
  undefined8 local_100;
  char *local_f8;
  code *local_f0;
  undefined8 local_e8;
  char *local_e0;
  code *local_d8;
  undefined8 local_d0;
  char *local_c8;
  code *local_c0;
  undefined8 local_b8;
  char *local_b0;
  code *local_a8;
  undefined8 local_a0;
  char *local_98;
  code *local_90;
  undefined8 local_88;
  char *local_80;
  code *local_78;
  undefined8 local_70;
  char *local_68;
  code *local_60;
  undefined8 local_58;
  char *local_50;
  code *local_48;
  undefined8 local_40;
  char *local_38;
  code *local_30;
  undefined8 local_28;
  char *local_20;
  code *local_18;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_328.first.super_string_view._M_len = (size_t)&local_328.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_328,"must be called with at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((_func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
         **)local_328.first.super_string_view._M_len != &local_328.second) {
      operator_delete((void *)local_328.first.super_string_view._M_len,(ulong)(local_328.second + 1)
                     );
    }
    bVar2 = false;
  }
  else {
    if (cmStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::subcommand == '\0') {
      iVar3 = __cxa_guard_acquire(&cmStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::subcommand);
      if (iVar3 != 0) {
        local_328.first.super_string_view._M_len = 5;
        local_328.first.super_string_view._M_str = "REGEX";
        local_328.second = anon_unknown.dwarf_8d5133::HandleRegexCommand;
        local_310 = 7;
        local_308 = "REPLACE";
        local_300 = anon_unknown.dwarf_8d5133::HandleReplaceCommand;
        local_2f8 = 3;
        local_2f0 = "MD5";
        local_2e8 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_2e0 = 4;
        local_2d8 = "SHA1";
        local_2d0 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_2c8 = 6;
        local_2c0 = "SHA224";
        local_2b8 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_2b0 = 6;
        local_2a8 = "SHA256";
        local_2a0 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_298 = 6;
        local_290 = "SHA384";
        local_288 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_280 = 6;
        local_278 = "SHA512";
        local_270 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_268 = 8;
        local_260 = "SHA3_224";
        local_258 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_250 = 8;
        local_248 = "SHA3_256";
        local_240 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_238 = 8;
        local_230 = "SHA3_384";
        local_228 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_220 = 8;
        local_218 = "SHA3_512";
        local_210 = anon_unknown.dwarf_8d5133::HandleHashCommand;
        local_208 = 7;
        local_200 = "TOLOWER";
        local_1f8 = anon_unknown.dwarf_8d5133::HandleToLowerCommand;
        local_1f0 = 7;
        local_1e8 = "TOUPPER";
        local_1e0 = anon_unknown.dwarf_8d5133::HandleToUpperCommand;
        local_1d8 = 7;
        local_1d0 = "COMPARE";
        local_1c8 = anon_unknown.dwarf_8d5133::HandleCompareCommand;
        local_1c0 = 5;
        local_1b8 = "ASCII";
        local_1b0 = anon_unknown.dwarf_8d5133::HandleAsciiCommand;
        local_1a8 = 3;
        local_1a0 = "HEX";
        local_198 = anon_unknown.dwarf_8d5133::HandleHexCommand;
        local_190 = 9;
        local_188 = "CONFIGURE";
        local_180 = anon_unknown.dwarf_8d5133::HandleConfigureCommand;
        local_178 = 6;
        local_170 = "LENGTH";
        local_168 = anon_unknown.dwarf_8d5133::HandleLengthCommand;
        local_160 = 6;
        local_158 = "APPEND";
        local_150 = anon_unknown.dwarf_8d5133::HandleAppendCommand;
        local_148 = 7;
        local_140 = "PREPEND";
        local_138 = anon_unknown.dwarf_8d5133::HandlePrependCommand;
        local_130 = 6;
        local_128 = "CONCAT";
        local_120 = anon_unknown.dwarf_8d5133::HandleConcatCommand;
        local_118 = 4;
        local_110 = "JOIN";
        local_108 = anon_unknown.dwarf_8d5133::HandleJoinCommand;
        local_100 = 9;
        local_f8 = "SUBSTRING";
        local_f0 = anon_unknown.dwarf_8d5133::HandleSubstringCommand;
        local_e8 = 5;
        local_e0 = "STRIP";
        local_d8 = anon_unknown.dwarf_8d5133::HandleStripCommand;
        local_d0 = 6;
        local_c8 = "REPEAT";
        local_c0 = anon_unknown.dwarf_8d5133::HandleRepeatCommand;
        local_b8 = 6;
        local_b0 = "RANDOM";
        local_a8 = anon_unknown.dwarf_8d5133::HandleRandomCommand;
        local_a0 = 4;
        local_98 = "FIND";
        local_90 = anon_unknown.dwarf_8d5133::HandleFindCommand;
        local_88 = 9;
        local_80 = "TIMESTAMP";
        local_78 = anon_unknown.dwarf_8d5133::HandleTimestampCommand;
        local_70 = 0x11;
        local_68 = "MAKE_C_IDENTIFIER";
        local_60 = anon_unknown.dwarf_8d5133::HandleMakeCIdentifierCommand;
        local_58 = 0xb;
        local_50 = "GENEX_STRIP";
        local_48 = anon_unknown.dwarf_8d5133::HandleGenexStripCommand;
        local_40 = 4;
        local_38 = "UUID";
        local_30 = anon_unknown.dwarf_8d5133::HandleUuidCommand;
        local_28 = 4;
        local_20 = "JSON";
        local_18 = anon_unknown.dwarf_8d5133::HandleJSONCommand;
        init._M_len = 0x21;
        init._M_array = &local_328;
        cmSubcommandTable::cmSubcommandTable(&cmStringCommand::subcommand,init);
        __cxa_atexit(cmSubcommandTable::~cmSubcommandTable,&cmStringCommand::subcommand,
                     &__dso_handle);
        __cxa_guard_release(&cmStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::subcommand);
      }
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    key._M_str = (pbVar1->_M_dataplus)._M_p;
    key._M_len = pbVar1->_M_string_length;
    bVar2 = cmSubcommandTable::operator()(&cmStringCommand::subcommand,key,args,status);
  }
  return bVar2;
}

Assistant:

bool cmStringCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be called with at least one argument.");
    return false;
  }

  static cmSubcommandTable const subcommand{
    { "REGEX"_s, HandleRegexCommand },
    { "REPLACE"_s, HandleReplaceCommand },
    { "MD5"_s, HandleHashCommand },
    { "SHA1"_s, HandleHashCommand },
    { "SHA224"_s, HandleHashCommand },
    { "SHA256"_s, HandleHashCommand },
    { "SHA384"_s, HandleHashCommand },
    { "SHA512"_s, HandleHashCommand },
    { "SHA3_224"_s, HandleHashCommand },
    { "SHA3_256"_s, HandleHashCommand },
    { "SHA3_384"_s, HandleHashCommand },
    { "SHA3_512"_s, HandleHashCommand },
    { "TOLOWER"_s, HandleToLowerCommand },
    { "TOUPPER"_s, HandleToUpperCommand },
    { "COMPARE"_s, HandleCompareCommand },
    { "ASCII"_s, HandleAsciiCommand },
    { "HEX"_s, HandleHexCommand },
    { "CONFIGURE"_s, HandleConfigureCommand },
    { "LENGTH"_s, HandleLengthCommand },
    { "APPEND"_s, HandleAppendCommand },
    { "PREPEND"_s, HandlePrependCommand },
    { "CONCAT"_s, HandleConcatCommand },
    { "JOIN"_s, HandleJoinCommand },
    { "SUBSTRING"_s, HandleSubstringCommand },
    { "STRIP"_s, HandleStripCommand },
    { "REPEAT"_s, HandleRepeatCommand },
    { "RANDOM"_s, HandleRandomCommand },
    { "FIND"_s, HandleFindCommand },
    { "TIMESTAMP"_s, HandleTimestampCommand },
    { "MAKE_C_IDENTIFIER"_s, HandleMakeCIdentifierCommand },
    { "GENEX_STRIP"_s, HandleGenexStripCommand },
    { "UUID"_s, HandleUuidCommand },
    { "JSON"_s, HandleJSONCommand },
  };

  return subcommand(args[0], args, status);
}